

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::Camera::readFrom(Camera *this,BinaryReader *binary)

{
  size_t sVar1;
  float *pfVar2;
  pointer puVar3;
  size_t sVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  runtime_error *this_00;
  
  puVar3 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3) <
      binary->currentEntityOffset + 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    this->fov = *(float *)(puVar3 + binary->currentEntityOffset);
    sVar4 = binary->currentEntityOffset;
    sVar1 = sVar4 + 4;
    binary->currentEntityOffset = sVar1;
    puVar3 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3) < sVar4 + 8) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      this->focalDistance = *(float *)(puVar3 + sVar1);
      sVar4 = binary->currentEntityOffset;
      sVar1 = sVar4 + 4;
      binary->currentEntityOffset = sVar1;
      puVar3 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(binary->currentEntityData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3) < sVar4 + 8) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"invalid read attempt by entity - not enough data in data block!");
      }
      else {
        this->lensRadius = *(float *)(puVar3 + sVar1);
        sVar1 = binary->currentEntityOffset;
        binary->currentEntityOffset = sVar1 + 4;
        puVar3 = (binary->currentEntityData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(binary->currentEntityData).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar3) < sVar1 + 0x34) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
        }
        else {
          pfVar2 = (float *)(puVar3 + sVar1 + 4);
          fVar5 = *pfVar2;
          fVar6 = pfVar2[1];
          fVar7 = pfVar2[2];
          fVar8 = pfVar2[3];
          pfVar2 = (float *)(puVar3 + sVar1 + 0x14);
          fVar9 = *pfVar2;
          fVar10 = pfVar2[1];
          fVar11 = pfVar2[2];
          fVar12 = pfVar2[3];
          pfVar2 = (float *)(puVar3 + sVar1 + 0x24);
          fVar13 = pfVar2[1];
          fVar14 = pfVar2[2];
          fVar15 = pfVar2[3];
          (this->frame).l.vz.z = *pfVar2;
          (this->frame).p.x = fVar13;
          (this->frame).p.y = fVar14;
          (this->frame).p.z = fVar15;
          (this->frame).l.vy.y = fVar9;
          (this->frame).l.vy.z = fVar10;
          (this->frame).l.vz.x = fVar11;
          (this->frame).l.vz.y = fVar12;
          (this->frame).l.vx.x = fVar5;
          (this->frame).l.vx.y = fVar6;
          (this->frame).l.vx.z = fVar7;
          (this->frame).l.vy.x = fVar8;
          sVar4 = binary->currentEntityOffset;
          sVar1 = sVar4 + 0x30;
          binary->currentEntityOffset = sVar1;
          puVar3 = (binary->currentEntityData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (sVar4 + 0x78 <=
              (ulong)((long)(binary->currentEntityData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
            memcpy(&this->simplified,puVar3 + sVar1,0x48);
            binary->currentEntityOffset = binary->currentEntityOffset + 0x48;
            return;
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
        }
      }
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Camera::readFrom(BinaryReader &binary) 
  {
    binary.read(fov);
    binary.read(focalDistance);
    binary.read(lensRadius);
    binary.read(frame);
    binary.read(simplified);
  }